

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobondrot.c
# Opt level: O3

void appendAtomRec(transformData *xform,char *rec,abrMkAtomProc *mkAtom,void *atomstuff)

{
  xformAtomRecords *pxVar1;
  xformAtomRecords *pxVar2;
  
  if (rec == (char *)0x0 || xform == (transformData *)0x0) {
    return;
  }
  pxVar1 = newXformAtomRecord(rec,mkAtom,atomstuff);
  if (pxVar1 == (xformAtomRecords *)0x0) {
    return;
  }
  if (xform->recs == (xformAtomRecords *)0x0) {
    pxVar2 = (xformAtomRecords *)&xform->recs;
  }
  else {
    pxVar2 = xform->lastrec;
    if (pxVar2 == (xformAtomRecords *)0x0) goto LAB_001214cc;
  }
  pxVar2->next = pxVar1;
LAB_001214cc:
  xform->lastrec = pxVar1;
  return;
}

Assistant:

void appendAtomRec(transformData* xform, char* rec, abrMkAtomProc mkAtom, void *atomstuff) {
   xformAtomRecords * xr = NULL;

   if (xform && rec) {
      xr = newXformAtomRecord(rec, mkAtom, atomstuff);

      if (xr) {
	 if (xform->recs == NULL) {
	    xform->recs    = xr;
	    xform->lastrec = NULL;
	 }
	 if (xform->lastrec != NULL) {
	    xform->lastrec->next = xr;
	 }
	 xform->lastrec = xr;
      }
   }
}